

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O2

int wrapped_vprintf(char *format,__va_list_tag *ap)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  code *UNRECOVERED_JUMPTABLE;
  curious_file_record_t *pcVar5;
  ulong local_50;
  undefined4 local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 local_30;
  
  lVar4 = __tls_get_addr(&PTR_00291758);
  piVar1 = (int *)(lVar4 + 0xc);
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (code *)gotcha_get_wrappee(io_fns[0x1d].handle);
  if ((*piVar1 == 1) && (wrappers_enabled != 0)) {
    pcVar5 = get_curious_file_record(1);
    if (pcVar5 == (curious_file_record_t *)0x0) {
      local_40 = 0;
      uStack_3c = 0;
      uStack_38 = 0;
      uStack_34 = 0;
    }
    else {
      local_40 = *(undefined4 *)&pcVar5->filesystem;
      uStack_3c = *(undefined4 *)((long)&pcVar5->filesystem + 4);
      uStack_38 = *(undefined4 *)&pcVar5->mount_point;
      uStack_34 = *(undefined4 *)((long)&pcVar5->mount_point + 4);
    }
    local_50 = 0;
    local_48 = 0;
    local_30 = 0x1d;
    curious_call_callbacks(2,&local_50);
    uVar3 = (*UNRECOVERED_JUMPTABLE)(format,ap);
    local_48 = 1;
    if (0 < (int)uVar3) {
      local_50 = (ulong)uVar3;
    }
    curious_call_callbacks(3,&local_50);
    *piVar1 = *piVar1 + -1;
    return uVar3;
  }
  *piVar1 = *piVar1 + -1;
  iVar2 = (*UNRECOVERED_JUMPTABLE)(format,ap);
  return iVar2;
}

Assistant:

int wrapped_vprintf(const char* format, va_list ap)
{
    WRAPPER_ENTER(vprintf);

    // Get the handle for the original function
    vprintf_f orig_vprintf = (vprintf_f) gotcha_get_wrappee(io_fns[CURIOUS_VPRINTF_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(STDOUT_FILENO);
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_write_record_t io_args = {
            .bytes_written = 0,
            .call_count    = 0,
            .filesystem    = filesystem,
            .mount_point   = mount_point,
            .function_id   = CURIOUS_VPRINTF_ID,
        };
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK, &io_args);

        // Call the original, saving the result...
        int return_val     = orig_vprintf(format, ap);
        io_args.call_count = 1;
        if (return_val > 0) {
            io_args.bytes_written = return_val;
        }

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, vprintf);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_vprintf(format, ap), vprintf);
    }
}